

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_spec.hpp
# Opt level: O3

bool __thiscall Catch::TestSpec::NamePattern::matches(NamePattern *this,TestCaseInfo *testCase)

{
  bool bVar1;
  string local_38;
  
  toLower(&local_38,&testCase->name);
  bVar1 = WildcardPattern::matches(&this->m_wildcardPattern,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

virtual bool matches( TestCaseInfo const& testCase ) const {
                return m_wildcardPattern.matches( toLower( testCase.name ) );
            }